

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclPrintBuffersInt(SC_Man *p,Abc_Obj_t *pObj,int nOffset)

{
  Abc_Obj_t *pObj_00;
  long lVar1;
  
  Abc_SclPrintBuffersOne(p,pObj,nOffset);
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
    for (lVar1 = 0; lVar1 < (pObj->vFanouts).nSize; lVar1 = lVar1 + 1) {
      pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]];
      if (((*(uint *)&pObj_00->field_0x14 & 0xf) == 7) && ((pObj_00->vFanins).nSize == 1)) {
        Abc_SclPrintBuffersInt(p,pObj_00,nOffset + 1);
      }
    }
    return;
  }
  __assert_fail("Abc_ObjIsBuffer(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                ,0x36c,"void Abc_SclPrintBuffersInt(SC_Man *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_SclPrintBuffersInt( SC_Man * p, Abc_Obj_t * pObj, int nOffset )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_SclPrintBuffersOne( p, pObj, nOffset );
    assert( Abc_ObjIsBuffer(pObj) );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            Abc_SclPrintBuffersInt( p, pFanout, nOffset + 1 );
}